

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compare.h
# Opt level: O2

bool Gs::Compare<float,3ul>(Vector<float,_3UL> *lhs,Vector<float,_3UL> *rhs)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    uVar1 = uVar2;
    uVar2 = uVar1;
    if (uVar1 == 3) goto LAB_00106922;
    if ((&lhs->x)[uVar1] < (&rhs->x)[uVar1]) {
      uVar2 = 1;
      goto LAB_00106922;
    }
    uVar2 = uVar1 + 1;
  } while ((&lhs->x)[uVar1] <= (&rhs->x)[uVar1]);
  uVar2 = 0;
LAB_00106922:
  return (bool)(uVar1 < 3 & (byte)uVar2);
}

Assistant:

bool Compare(const Vector<T, N>& lhs, const Vector<T, N>& rhs)
{
    for (std::size_t i = 0; i < N; ++i)
    {
        if (lhs[i] < rhs[i])
            return true;
        if (lhs[i] > rhs[i])
            return false;
    }
    return false;
}